

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

size_t hashmap_hash(char *data,size_t length)

{
  size_t sVar1;
  size_t i;
  size_t h;
  
  sVar1 = length;
  for (i = 0; length != i; i = i + 1) {
    sVar1 = (long)data[i] + sVar1 * 0x1f;
  }
  return sVar1;
}

Assistant:

static size_t hashmap_hash(const char* data, size_t length)
{
    size_t h = length;
    for(size_t i = 0; i < length; i++) {
        h = h * 31 + *data;
        ++data;
    }

    return h;
}